

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lateral_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::LateralBinder::BindExpression
          (BindResult *__return_storage_ptr__,LateralBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  type expr;
  allocator local_49;
  string local_48;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 == COLUMN_REF) {
    BindColumnRef(__return_storage_ptr__,this,expr_ptr,depth,false);
  }
  else {
    if (EVar1 == WINDOW) {
      ::std::__cxx11::string::string
                ((string *)&local_48,"LATERAL join cannot contain window functions!",&local_49);
      ExpressionBinder::BindUnsupportedExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,expr,depth,&local_48);
    }
    else {
      if (EVar1 != DEFAULT) {
        ExpressionBinder::BindExpression
                  (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::string
                ((string *)&local_48,"LATERAL join cannot contain DEFAULT clause!",&local_49);
      ExpressionBinder::BindUnsupportedExpression
                (__return_storage_ptr__,&this->super_ExpressionBinder,expr,depth,&local_48);
    }
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult LateralBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::DEFAULT:
		return BindUnsupportedExpression(expr, depth, "LATERAL join cannot contain DEFAULT clause!");
	case ExpressionClass::WINDOW:
		return BindUnsupportedExpression(expr, depth, "LATERAL join cannot contain window functions!");
	case ExpressionClass::COLUMN_REF:
		return BindColumnRef(expr_ptr, depth, root_expression);
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}